

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ya_getopt.cc
# Opt level: O3

int ya_getopt_longopts(int argc,char **argv,char *arg,char *optstring,option *longopts,
                      int *longindex,int *long_only_flag)

{
  int *piVar1;
  int iVar2;
  size_t __n;
  char *pcVar3;
  option *poVar4;
  int iVar5;
  
  pcVar3 = longopts->name;
  if (pcVar3 != (char *)0x0) {
    poVar4 = longopts + 1;
    iVar5 = 0;
    do {
      __n = strlen(pcVar3);
      iVar2 = strncmp(arg,pcVar3,__n);
      if (iVar2 == 0) {
        if (arg[__n] == '=') {
          if (poVar4[-1].has_arg == 0) {
            pcVar3 = "-";
            if (argv[ya_optind][1] == '-') {
              pcVar3 = "--";
            }
            ya_optind = ya_optind + 1;
            ya_optarg = (char *)0x0;
            ya_optopt = poVar4[-1].val;
            ya_getopt_error(optstring,"%s: option \'%s%s\' doesn\'t allow an argument\n",*argv,
                            pcVar3,poVar4[-1].name);
            return 0x3f;
          }
          ya_optarg = arg + __n + 1;
LAB_00108b19:
          ya_optind = ya_optind + 1;
          piVar1 = poVar4[-1].flag;
          if (piVar1 != (int *)0x0) {
            *piVar1 = poVar4[-1].val;
          }
          if (longindex != (int *)0x0) {
            *longindex = iVar5;
          }
          if (piVar1 == (int *)0x0) {
            return poVar4[-1].val;
          }
          return 0;
        }
        if (arg[__n] == '\0') {
          if (poVar4[-1].has_arg == 1) {
            iVar2 = ya_optind + 1;
            if (iVar2 == argc) {
              ya_optarg = (char *)0x0;
              ya_optopt = poVar4[-1].val;
              ya_optind = iVar2;
              ya_getopt_error(optstring,"%s: option \'--%s\' requires an argument\n",*argv,
                              poVar4[-1].name);
              return (uint)(*optstring != ':') * 5 + 0x3a;
            }
            ya_optarg = argv[(long)ya_optind + 1];
            ya_optind = iVar2;
          }
          else {
            ya_optarg = (char *)0x0;
          }
          goto LAB_00108b19;
        }
      }
      pcVar3 = poVar4->name;
      poVar4 = poVar4 + 1;
      iVar5 = iVar5 + 1;
    } while (pcVar3 != (char *)0x0);
  }
  if (long_only_flag == (int *)0x0) {
    ya_getopt_error(optstring,"%s: unrecognized option \'%s\'\n",*argv,argv[ya_optind]);
    ya_optind = ya_optind + 1;
  }
  else {
    *long_only_flag = 1;
  }
  return 0x3f;
}

Assistant:

static int ya_getopt_longopts(int argc, char * const argv[], char *arg, const char *optstring, const struct option *longopts, int *longindex, int *long_only_flag)
{
    char *val = NULL;
    const struct option *opt;
    size_t namelen;
    int idx;

    for (idx = 0; longopts[idx].name != NULL; idx++) {
        opt = &longopts[idx];
        namelen = strlen(opt->name);
        if (strncmp(arg, opt->name, namelen) == 0) {
            switch (arg[namelen]) {
            case '\0':
                switch (opt->has_arg) {
                case ya_required_argument:
                    ya_optind++;
                    if (ya_optind == argc) {
                        ya_optarg = NULL;
                        ya_optopt = opt->val;
                        ya_getopt_error(optstring, "%s: option '--%s' requires an argument\n", argv[0], opt->name);
                        if (optstring[0] == ':') {
                            return ':';
                        } else {
                            return '?';
                        }
                    }
                    val = argv[ya_optind];
                    break;
                }
                goto found;
            case '=':
                if (opt->has_arg == ya_no_argument) {
                    const char *hyphens = (argv[ya_optind][1] == '-') ? "--" : "-";

                    ya_optind++;
                    ya_optarg = NULL;
                    ya_optopt = opt->val;
                    ya_getopt_error(optstring, "%s: option '%s%s' doesn't allow an argument\n", argv[0], hyphens, opt->name);
                    return '?';
                }
                val = arg + namelen + 1;
                goto found;
            }
        }
    }
    if (long_only_flag) {
        *long_only_flag = 1;
    } else {
        ya_getopt_error(optstring, "%s: unrecognized option '%s'\n", argv[0], argv[ya_optind]);
        ya_optind++;
    }
    return '?';
found:
    ya_optarg = val;
    ya_optind++;
    if (opt->flag) {
        *opt->flag = opt->val;
    }
    if (longindex) {
        *longindex = idx;
    }
    return opt->flag ? 0 : opt->val;
}